

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O2

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<int,_int>,_3UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<int,_int>,_3UL>_>_>
         *this)

{
  code *pcVar1;
  SmallVectorBase<std::pair<int,int>> *pSVar2;
  int iVar3;
  EVP_PKEY_CTX *in_RSI;
  int local_60;
  int local_5c;
  CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<int,_int>,_3UL>_> obj;
  
  anon_unknown.dwarf_965823::Constructable::reset();
  obj.
  super_SmallVectorInternalReferenceInvalidationTest<slang::SmallVector<std::pair<int,_int>,_3UL>_>.
  v.super_SmallVectorBase<std::pair<int,_int>_>.data_ =
       (pointer)obj.
                super_SmallVectorInternalReferenceInvalidationTest<slang::SmallVector<std::pair<int,_int>,_3UL>_>
                .v.super_SmallVectorBase<std::pair<int,_int>_>.firstElement;
  obj.
  super_SmallVectorInternalReferenceInvalidationTest<slang::SmallVector<std::pair<int,_int>,_3UL>_>.
  v.super_SmallVectorBase<std::pair<int,_int>_>.len = 0;
  obj.
  super_SmallVectorInternalReferenceInvalidationTest<slang::SmallVector<std::pair<int,_int>,_3UL>_>.
  v.super_SmallVectorBase<std::pair<int,_int>_>.cap = 3;
  for (iVar3 = 1; iVar3 != 4; iVar3 = iVar3 + 1) {
    in_RSI = (EVP_PKEY_CTX *)&local_5c;
    local_60 = iVar3;
    local_5c = iVar3;
    slang::SmallVectorBase<std::pair<int,int>>::emplace_back<int,int>
              ((SmallVectorBase<std::pair<int,int>> *)&obj,&local_5c,&local_60);
  }
  pcVar1 = (code *)this->m_testAsMethod;
  pSVar2 = (SmallVectorBase<std::pair<int,int>> *)&obj + *(long *)&this->field_0x10;
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *(long *)pSVar2 + -1);
  }
  (*pcVar1)(pSVar2);
  slang::SmallVectorBase<std::pair<int,_int>_>::cleanup
            ((SmallVectorBase<std::pair<int,_int>_> *)&obj,in_RSI);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }